

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tick.cpp
# Opt level: O0

bool P_CheckTickerPaused(void)

{
  bool local_9;
  
  if ((((netgame) || (gamestate == GS_TITLELEVEL)) ||
      (((menuactive == MENU_Off || (menuactive == MENU_OnNoPause)) &&
       ((ConsoleState != c_down && (ConsoleState != c_falling)))))) ||
     ((demoplayback ||
      ((demorecording ||
       (((*(double *)(&DAT_01ae7120 + (long)consoleplayer * 0x2a0) == 3.4028234663852886e+38 &&
         (!NAN(*(double *)(&DAT_01ae7120 + (long)consoleplayer * 0x2a0)))) ||
        (wipegamestate != gamestate)))))))) {
    local_9 = false;
  }
  else {
    S_PauseSound((bool)(((level.flags2 & 0x1000) != 0 ^ 0xffU) & 1),false);
    local_9 = true;
  }
  return local_9;
}

Assistant:

bool P_CheckTickerPaused ()
{
	// pause if in menu or console and at least one tic has been run
	if ( !netgame
		 && gamestate != GS_TITLELEVEL
		 && ((menuactive != MENU_Off && menuactive != MENU_OnNoPause) ||
			 ConsoleState == c_down || ConsoleState == c_falling)
		 && !demoplayback
		 && !demorecording
		 && players[consoleplayer].viewz != NO_VALUE
		 && wipegamestate == gamestate)
	{
		S_PauseSound (!(level.flags2 & LEVEL2_PAUSE_MUSIC_IN_MENUS), false);
		return true;
	}
	return false;
}